

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

bool saves_spell(int level,CHAR_DATA *victim,int dam_type)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  AFFECT_DATA *pAVar4;
  int in_EDX;
  CHAR_DATA *in_RSI;
  int in_EDI;
  __type_conflict2 _Var5;
  double dVar6;
  int in_stack_00000014;
  CHAR_DATA *in_stack_00000018;
  AFFECT_DATA *af;
  float save;
  int roll;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  float local_50;
  float local_4c;
  CHAR_DATA *ch;
  float local_1c;
  bool local_1;
  
  if ((in_RSI->fighting == (CHAR_DATA *)0x0) ||
     (iVar3 = get_trust(in_stack_ffffffffffffffa8), iVar3 != 0x3c)) {
    if (in_RSI->saving_throw < 0) {
      sVar1 = in_RSI->level;
      _Var5 = std::sqrt<int>(0);
      dVar6 = _Var5 * 4.0 + (double)((sVar1 - in_EDI) * 4 + 0x28);
    }
    else {
      sVar1 = in_RSI->level;
      _Var5 = std::sqrt<short>(0);
      dVar6 = -_Var5 * 4.0 + (double)((sVar1 - in_EDI) * 4 + 0x2d);
    }
    local_1c = (float)dVar6;
    bVar2 = is_npc(in_stack_ffffffffffffffa8);
    if (bVar2) {
      local_1c = (float)((int)in_RSI->level / 3) + local_1c;
    }
    iVar3 = check_immune(in_stack_00000018,in_stack_00000014);
    if (iVar3 == 1) {
      local_1 = true;
    }
    else {
      if (iVar3 == 2) {
        bVar2 = is_npc(in_stack_ffffffffffffffa8);
        if ((bVar2) || (bVar2 = str_cmp(pc_race_table[in_RSI->race].name,"imp"), bVar2)) {
          local_1c = local_1c * 1.3;
        }
        else {
          local_1c = local_1c * 1.1;
        }
      }
      else if (iVar3 == 3) {
        local_1c = local_1c * 0.7;
      }
      ch = in_RSI;
      iVar3 = skill_lookup((char *)in_RSI);
      bVar2 = is_affected(ch,iVar3);
      if ((bVar2) && ((iVar3 = number_percent(), iVar3 < 0x32 || (in_EDX == 10)))) {
        local_1 = true;
      }
      else {
        bVar2 = is_affected(in_RSI,(int)gsn_traitors_luck);
        if ((bVar2) &&
           ((pAVar4 = affect_find(in_RSI->affected,(int)gsn_traitors_luck),
            in_RSI->fighting != (CHAR_DATA *)0x0 && (in_RSI->fighting == pAVar4->owner)))) {
          local_1c = local_1c - 50.0;
        }
        bVar2 = is_affected_room(in_RSI->in_room,(int)gsn_infidels_fate);
        if ((bVar2) && (bVar2 = is_good(in_stack_ffffffffffffffa8), bVar2)) {
          local_1c = local_1c - 20.0;
        }
        if (5.0 <= local_1c) {
          if (local_1c <= 95.0) {
            local_50 = local_1c;
          }
          else {
            local_50 = 95.0;
          }
          local_4c = local_50;
        }
        else {
          local_4c = 5.0;
        }
        iVar3 = number_percent();
        local_1 = iVar3 < (int)local_4c;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool saves_spell(int level, CHAR_DATA *victim, int dam_type)
{
	int roll;
	float save;
	AFFECT_DATA *af;
	//    char buf[MSL];
	if (victim->fighting && get_trust(victim->fighting) == MAX_LEVEL)
		return false;

	if (victim->saving_throw < 0)
		save = 40 + (victim->level - level) * 4 + (sqrt(abs(victim->saving_throw))) * 4;
	else
		save = 45 + (victim->level - level) * 4 - (sqrt(victim->saving_throw)) * 4;

	if (is_npc(victim))
		save += victim->level / 3; /* simulate npc saving throw */

	switch (check_immune(victim, dam_type))
	{
		case IS_IMMUNE:
			return true;
		case IS_RESISTANT:
			if (!is_npc(victim) && !str_cmp(pc_race_table[victim->race].name, "imp"))
				save *= 1.1;
			else
				save *= 1.3;

			break;
		case IS_VULNERABLE:
			save *= .7;
			break;
	}

	if (is_affected(victim, skill_lookup("strength of faith")) && (number_percent() < 50 || dam_type == DAM_HOLY))
		return true;

	/*
	if (!is_npc(victim) && victim->Class()->fMana)
		save = 9 * save / 10;
	*/

	if (is_affected(victim, gsn_traitors_luck))
	{
		af = affect_find(victim->affected, gsn_traitors_luck);
		if (victim->fighting && (victim->fighting == af->owner))
			save -= 50;
	}

	if (is_affected_room(victim->in_room, gsn_infidels_fate) && is_good(victim))
		save -= 20;

	save = URANGE(5, save, 95);
	roll = number_percent();

	/*
	if(victim->fighting && !is_npc(victim->fighting) && !is_npc(victim))
	{
		sprintf(buf,"Saves_spell: Caster is probably %s, victim is %s, dt is %d.  Victim level %d, spell level %d (%d - %.2f%%mod)."\
			" Victim has %dsvs (%.2f%%mod).  Chance of saving is %d, roll is %d: %s",
			victim->fighting->name,
			victim->true_name,
			dam_type,
			victim->level,
			level,
			victim->level - level,
			(float)((victim->level - level) * 4),
			victim->saving_throw,
			(float)sqrt(abs(victim->saving_throw)) * 4,
			save,
			roll,
			roll < save ? "SAVED" : "FAILED");
		wiznet(buf,0,nullptr,WIZ_DEBUG,0,0);
	}
	else if(!is_npc(victim))
	{
		sprintf(buf,"Saves_spell: victim is %s.  Victim level %d, spell level %d (%d - %.2f%%mod).",
			victim->name,
			victim->level,
			level,
			victim->level - level,
			(float)((victim->level - level) * 4));
		wiznet(buf,0,nullptr,WIZ_DEBUG,0,0);
	}
	*/

	return (roll < (int)save);
}